

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::ConvertUnew(Projection *this,FArrayBox *Unew,FArrayBox *Uold,Real alpha,Box *grd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int j;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int k;
  long lVar25;
  long lVar26;
  
  iVar1 = (Unew->super_BaseFab<double>).domain.smallend.vect[0];
  iVar2 = (Unew->super_BaseFab<double>).domain.smallend.vect[1];
  iVar3 = (Unew->super_BaseFab<double>).domain.smallend.vect[2];
  iVar4 = (Unew->super_BaseFab<double>).domain.bigend.vect[2];
  lVar11 = (long)(((Unew->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar25 = (long)(((Unew->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  iVar5 = (Uold->super_BaseFab<double>).domain.smallend.vect[0];
  iVar6 = (Uold->super_BaseFab<double>).domain.smallend.vect[1];
  iVar7 = (Uold->super_BaseFab<double>).domain.smallend.vect[2];
  lVar19 = (long)(grd->smallend).vect[1];
  lVar14 = (long)(grd->smallend).vect[2];
  lVar16 = lVar19 * 8;
  iVar8 = (grd->smallend).vect[0];
  iVar9 = (Uold->super_BaseFab<double>).domain.bigend.vect[2];
  lVar17 = (lVar16 + (lVar14 - iVar3) * lVar25 * 8 + (long)iVar2 * -8) * lVar11 + (long)iVar8 * 8 +
           (long)iVar1 * -8 + (long)(Unew->super_BaseFab<double>).dptr;
  lVar12 = (long)(((Uold->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1);
  lVar24 = (long)(((Uold->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
  iVar1 = (grd->bigend).vect[0];
  iVar2 = (grd->bigend).vect[1];
  iVar10 = (grd->bigend).vect[2];
  lVar21 = (lVar16 + (lVar14 - iVar7) * lVar12 * 8 + (long)iVar6 * -8) * lVar24 + (long)iVar8 * 8 +
           (long)iVar5 * -8 + (long)(Uold->super_BaseFab<double>).dptr;
  lVar25 = lVar25 * lVar11;
  lVar12 = lVar12 * lVar24;
  for (lVar16 = 0; lVar18 = lVar17, lVar22 = lVar21, lVar26 = lVar14, lVar16 != 3;
      lVar16 = lVar16 + 1) {
    for (; lVar13 = lVar18, lVar20 = lVar19, lVar23 = lVar22, lVar26 <= iVar10; lVar26 = lVar26 + 1)
    {
      for (; lVar20 <= iVar2; lVar20 = lVar20 + 1) {
        if (iVar8 <= iVar1) {
          lVar15 = 0;
          do {
            *(double *)(lVar13 + lVar15 * 8) =
                 (*(double *)(lVar13 + lVar15 * 8) - *(double *)(lVar23 + lVar15 * 8)) *
                 (1.0 / alpha);
            lVar15 = lVar15 + 1;
          } while ((iVar1 - iVar8) + 1 != (int)lVar15);
        }
        lVar13 = lVar13 + lVar11 * 8;
        lVar23 = lVar23 + lVar24 * 8;
      }
      lVar18 = lVar18 + lVar25 * 8;
      lVar22 = lVar22 + lVar12 * 8;
    }
    lVar17 = lVar17 + ((iVar4 - iVar3) + 1) * lVar25 * 8;
    lVar21 = lVar21 + ((iVar9 - iVar7) + 1) * lVar12 * 8;
  }
  return;
}

Assistant:

void
Projection::ConvertUnew( FArrayBox &Unew, FArrayBox &Uold, Real alpha,
                              const Box &grd )
{
    AMREX_ASSERT(Unew.nComp() >= AMREX_SPACEDIM);
    AMREX_ASSERT(Uold.nComp() >= AMREX_SPACEDIM);
    AMREX_ASSERT(Unew.contains(grd) == true);
    AMREX_ASSERT(Uold.contains(grd) == true);

    const auto& unew = Unew.array();
    const auto& uold = Uold.array();
    const Real dt_inv = 1.0/alpha;
    amrex::ParallelFor(grd, AMREX_SPACEDIM, [unew,uold,dt_inv]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
       unew(i,j,k,n) -= uold(i,j,k,n);
       unew(i,j,k,n) *= dt_inv;
    });
}